

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qspinbox.cpp
# Opt level: O2

QString * __thiscall
QSpinBox::textFromValue(QString *__return_storage_ptr__,QSpinBox *this,int value)

{
  uint uVar1;
  long lVar2;
  QLatin1String *pQVar3;
  Data *pDVar4;
  uint uVar5;
  int iVar6;
  long in_FS_OFFSET;
  QLocale loc;
  QArrayDataPointer<char16_t> local_98;
  QStringBuilder<const_QLatin1String_&,_QString> local_78;
  QArrayDataPointer<char16_t> local_58;
  QLatin1String local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&(this->super_QAbstractSpinBox).super_QWidget.field_0x8;
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  if (*(int *)(lVar2 + 0x3d4) == 10) {
    local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    QWidget::locale((QLocale *)&local_58,(QWidget *)this);
    uVar1 = *(uint *)(lVar2 + 0x3d0);
    uVar5 = QLocale::numberOptions();
    QLocale::setNumberOptions(&local_58,(uint)((uVar1 >> 9 & 1) == 0) | uVar5 & 0xfffffffe);
    QLocale::toString((QString *)&local_78,(QLocale *)&local_58,value);
    pQVar3 = local_78.a;
    local_78.a = (QLatin1String *)0x0;
    (__return_storage_ptr__->d).d = (Data *)pQVar3;
    (__return_storage_ptr__->d).ptr = (char16_t *)local_78.b.d.d;
    local_78.b.d.d = (Data *)0x0;
    (__return_storage_ptr__->d).size = (qsizetype)local_78.b.d.ptr;
    local_78.b.d.ptr = (char16_t *)0x0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
    QLocale::~QLocale((QLocale *)&local_58);
  }
  else {
    local_40.m_size = (qsizetype)((uint)value >> 0x1f);
    local_40.m_data = "";
    if (value < 0) {
      local_40.m_data = "-";
    }
    iVar6 = -value;
    if (0 < value) {
      iVar6 = value;
    }
    QString::number((int)&local_98,iVar6);
    local_78.b.d.size = local_98.size;
    local_78.b.d.ptr = local_98.ptr;
    local_78.b.d.d = local_98.d;
    local_98.d = (Data *)0x0;
    local_98.ptr = (char16_t *)0x0;
    local_98.size = 0;
    local_78.a = &local_40;
    QStringBuilder<const_QLatin1String_&,_QString>::convertTo<QString>
              ((QString *)&local_58,&local_78);
    pDVar4 = local_58.d;
    local_58.d = (Data *)0x0;
    (__return_storage_ptr__->d).d = pDVar4;
    (__return_storage_ptr__->d).ptr = local_58.ptr;
    local_58.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = local_58.size;
    local_58.size = 0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78.b.d);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QSpinBox::textFromValue(int value) const
{
    Q_D(const QSpinBox);
    QString str;

    if (d->displayIntegerBase != 10) {
        const auto prefix = value < 0 ? "-"_L1 : ""_L1;
        str = prefix + QString::number(qAbs(value), d->displayIntegerBase);
    } else {
        QLocale loc = locale();
        if (d->showGroupSeparator)
            loc.setNumberOptions(loc.numberOptions() & ~QLocale::OmitGroupSeparator);
        else
            loc.setNumberOptions(loc.numberOptions() | QLocale::OmitGroupSeparator);
        str = loc.toString(value);
    }

    return str;
}